

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

size_t rtosc_bundle_size(char *buffer,uint elm)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint *puVar4;
  
  uVar3 = (ulong)(elm + 1);
  if (elm + 1 != 0) {
    uVar1 = *(uint *)(buffer + 0x10);
    uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    if (uVar1 != 0) {
      puVar4 = (uint *)(buffer + 0x10);
      do {
        uVar2 = (ulong)uVar1;
        uVar3 = uVar3 - 1;
        if (uVar3 == 0) {
          return uVar2;
        }
        puVar4 = (uint *)((long)puVar4 + (ulong)(uVar1 & 0xfffffffc) + 4);
        uVar1 = *puVar4;
        uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      } while (uVar1 != 0);
      return uVar2;
    }
  }
  return 0;
}

Assistant:

size_t rtosc_bundle_size(const char *buffer, unsigned elm)
{
    const uint32_t *lengths = (const uint32_t*) (buffer+16);
    size_t elm_pos = 0;
    size_t last_len = 0;
    while(elm_pos!=elm+1 && extract_uint32((const uint8_t*)lengths)) {
        last_len = extract_uint32((const uint8_t*)lengths);
        ++elm_pos, lengths+=extract_uint32((const uint8_t*)lengths)/4+1;
    }

    return last_len;
}